

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

bool ON_FileSystem::IsFile(char *path)

{
  bool bVar1;
  int iVar2;
  stat s;
  stat local_90;
  
  if ((path != (char *)0x0) && (*path != '\0')) {
    iVar2 = stat(path,&local_90);
    if ((iVar2 != 0) || (bVar1 = true, (local_90.st_mode & 0xc000) != 0x8000)) {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_FileSystem::IsFile(
  const char* path
  )
{
  if (0 == path || 0 == path[0])
    return false;
#if defined(ON_COMPILER_MSC) && defined(ON_RUNTIME_WIN)
  return ::PathFileExistsA(path) && 0 == ::PathIsDirectoryA(path);
#else
  struct stat s;
  if (0 == stat(path, &s))
  {
    if (0 == (s.st_mode & S_IFDIR) && 0 != (s.st_mode & S_IFREG))
      return true;
  }
  return false;
#endif
}